

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcInstPrinter.c
# Opt level: O0

void Sparc_printInst(MCInst *MI,SStream *O,void *Info)

{
  _Bool _Var1;
  sparc_reg Op;
  uint uVar2;
  sparc_cc sVar3;
  sparc_hint sVar4;
  char *__src;
  char *pcVar5;
  MCInst *in_RDI;
  char instr [64];
  char *p;
  char *mnem;
  void *in_stack_00001338;
  SStream *in_stack_00001340;
  MCInst *in_stack_00001348;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  SStream *in_stack_ffffffffffffffa0;
  MCInst *in_stack_ffffffffffffffa8;
  MCRegisterInfo *in_stack_ffffffffffffffb0;
  SStream *in_stack_ffffffffffffffb8;
  MCInst *in_stack_ffffffffffffffc0;
  
  __src = printAliasInstr(in_stack_00001348,in_stack_00001340,in_stack_00001338);
  if (__src == (char *)0x0) {
    _Var1 = printSparcAliasInstr(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (_Var1) {
      return;
    }
    printInstruction(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    return;
  }
  strncpy(&stack0xffffffffffffff98,__src,0x40);
  pcVar5 = strchr(&stack0xffffffffffffff98,0x2c);
  if (pcVar5 != (char *)0x0) {
    *pcVar5 = '\0';
  }
  Op = Sparc_map_insn((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  MCInst_setOpcodePub(in_RDI,Op);
  uVar2 = MCInst_getOpcode(in_RDI);
  if (1 < uVar2 - 0x4a) {
    if (uVar2 - 0x51 < 2) {
      if (in_RDI->csh->detail != CS_OPT_OFF) {
        sVar3 = Sparc_map_FCC((char *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
        (in_RDI->flat_insn->detail->field_6).sparc.cc = sVar3;
        sVar4 = Sparc_map_hint(in_stack_ffffffffffffff98);
        (in_RDI->flat_insn->detail->field_6).sparc.hint = sVar4;
      }
      goto LAB_003649be;
    }
    if ((1 < uVar2 - 0x5d) && (1 < uVar2 - 0x6d)) {
      if ((uVar2 - 0xbb < 2) || ((uVar2 - 0xbf < 2 || (uVar2 - 0xd5 < 2)))) {
        if (in_RDI->csh->detail != CS_OPT_OFF) {
          sVar3 = Sparc_map_ICC((char *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
          (in_RDI->flat_insn->detail->field_6).sparc.cc = sVar3;
          sVar4 = Sparc_map_hint(in_stack_ffffffffffffff98);
          (in_RDI->flat_insn->detail->field_6).sparc.hint = sVar4;
        }
        goto LAB_003649be;
      }
      if ((uVar2 - 0x14a < 2) || (uVar2 - 0x15b < 2)) {
        if (in_RDI->csh->detail != CS_OPT_OFF) {
          sVar3 = Sparc_map_ICC((char *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
          (in_RDI->flat_insn->detail->field_6).sparc.cc = sVar3;
          sVar4 = Sparc_map_hint(in_stack_ffffffffffffff98);
          (in_RDI->flat_insn->detail->field_6).sparc.hint = sVar4;
        }
        goto LAB_003649be;
      }
      if (1 < uVar2 - 0x1c6) {
        if (uVar2 - 0x1da < 3) {
          if (in_RDI->csh->detail != CS_OPT_OFF) {
            sVar3 = Sparc_map_FCC((char *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
            (in_RDI->flat_insn->detail->field_6).sparc.cc = sVar3;
            sVar4 = Sparc_map_hint(in_stack_ffffffffffffff98);
            (in_RDI->flat_insn->detail->field_6).sparc.hint = sVar4;
          }
        }
        else if ((uVar2 - 0x1dd < 2) && (in_RDI->csh->detail != CS_OPT_OFF)) {
          sVar3 = Sparc_map_FCC((char *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
          (in_RDI->flat_insn->detail->field_6).sparc.cc = sVar3;
          sVar4 = Sparc_map_hint(in_stack_ffffffffffffff98);
          (in_RDI->flat_insn->detail->field_6).sparc.hint = sVar4;
        }
        goto LAB_003649be;
      }
    }
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    sVar3 = Sparc_map_ICC((char *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
    (in_RDI->flat_insn->detail->field_6).sparc.cc = sVar3;
    sVar4 = Sparc_map_hint(in_stack_ffffffffffffff98);
    (in_RDI->flat_insn->detail->field_6).sparc.hint = sVar4;
  }
LAB_003649be:
  (*cs_mem_free)(__src);
  return;
}

Assistant:

void Sparc_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem, *p;
	char instr[64];	// Sparc has no instruction this long

	mnem = printAliasInstr(MI, O, Info);
	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		strncpy(instr, mnem, sizeof(instr));
		instr[sizeof(instr) - 1] = '\0';
		// does this contains hint with a coma?
		p = strchr(instr, ',');
		if (p)
			*p = '\0';	// now instr only has instruction mnemonic
		MCInst_setOpcodePub(MI, Sparc_map_insn(instr));
		switch(MCInst_getOpcode(MI)) {
			case SP_BCOND:
			case SP_BCONDA:
			case SP_BPICCANT:
			case SP_BPICCNT:
			case SP_BPXCCANT:
			case SP_BPXCCNT:
			case SP_TXCCri:
			case SP_TXCCrr:
				if (MI->csh->detail) {
					// skip 'b', 't'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 1);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_BPFCCANT:
			case SP_BPFCCNT:
				if (MI->csh->detail) {
					// skip 'fb'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 2);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_FMOVD_ICC:
			case SP_FMOVD_XCC:
			case SP_FMOVQ_ICC:
			case SP_FMOVQ_XCC:
			case SP_FMOVS_ICC:
			case SP_FMOVS_XCC:
				if (MI->csh->detail) {
					// skip 'fmovd', 'fmovq', 'fmovs'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 5);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_MOVICCri:
			case SP_MOVICCrr:
			case SP_MOVXCCri:
			case SP_MOVXCCrr:
				if (MI->csh->detail) {
					// skip 'mov'
					MI->flat_insn->detail->sparc.cc = Sparc_map_ICC(instr + 3);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_V9FMOVD_FCC:
			case SP_V9FMOVQ_FCC:
			case SP_V9FMOVS_FCC:
				if (MI->csh->detail) {
					// skip 'fmovd', 'fmovq', 'fmovs'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 5);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			case SP_V9MOVFCCri:
			case SP_V9MOVFCCrr:
				if (MI->csh->detail) {
					// skip 'mov'
					MI->flat_insn->detail->sparc.cc = Sparc_map_FCC(instr + 3);
					MI->flat_insn->detail->sparc.hint = Sparc_map_hint(mnem);
				}
				break;
			default:
				break;
		}
		cs_mem_free(mnem);
	} else {
		if (!printSparcAliasInstr(MI, O))
			printInstruction(MI, O, NULL);
	}
}